

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

lysc_when *** lysc_node_when_p(lysc_node *node)

{
  ushort uVar1;
  lysc_when ***ppplVar2;
  
  if (node == (lysc_node *)0x0) {
    return (lysc_when ***)0x0;
  }
  uVar1 = node->nodetype;
  ppplVar2 = (lysc_when ***)0x0;
  if (uVar1 < 0x60) {
    switch(uVar1) {
    case 1:
      break;
    case 2:
    case 4:
    case 8:
switchD_001620ca_caseD_2:
      return (lysc_when ***)&node[1].module;
    case 3:
    case 5:
    case 6:
    case 7:
      return ppplVar2;
    default:
      if (uVar1 != 0x10) {
        if (uVar1 != 0x20) {
          return ppplVar2;
        }
        goto switchD_001620ca_caseD_2;
      }
    }
  }
  else {
    if (uVar1 < 0x100) {
      if ((uVar1 != 0x60) && (uVar1 != 0x80)) {
        return ppplVar2;
      }
      goto switchD_001620ca_caseD_2;
    }
    if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
      return (lysc_when ***)(node + 1);
    }
    if (uVar1 != 0x400) {
      return ppplVar2;
    }
  }
  return (lysc_when ***)&node[1].parent;
}

Assistant:

struct lysc_when ***
lysc_node_when_p(const struct lysc_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysc_node_container *)node)->when;
    case LYS_CHOICE:
        return &((struct lysc_node_choice *)node)->when;
    case LYS_LEAF:
        return &((struct lysc_node_leaf *)node)->when;
    case LYS_LEAFLIST:
        return &((struct lysc_node_leaflist *)node)->when;
    case LYS_LIST:
        return &((struct lysc_node_list *)node)->when;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysc_node_anydata *)node)->when;
    case LYS_CASE:
        return &((struct lysc_node_case *)node)->when;
    case LYS_NOTIF:
        return &((struct lysc_node_notif *)node)->when;
    case LYS_RPC:
    case LYS_ACTION:
        return &((struct lysc_node_action *)node)->when;
    default:
        return NULL;
    }
}